

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VDotProdMultiLocal(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_EDX;
  long in_RSI;
  N_Vector in_RDI;
  sunrealtype dotprods [3];
  N_Vector *V;
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 *local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  long local_10;
  N_Vector local_8;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  N_VConst(0x4000000000000000,local_8);
  N_VConst(0x3fe0000000000000,*local_40);
  local_28 = get_time();
  local_20 = N_VDotProdMultiLocal(1,local_8,local_40,&local_58);
  sync_device(local_8);
  local_30 = get_time();
  if (local_20 == 0) {
    local_1c = SUNRCompare(local_58,(double)local_10);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (local_14 == 0) {
      printf("PASSED test -- N_VDotProdMultiLocal Case 1 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n",(ulong)local_14);
    local_18 = local_18 + 1;
  }
  local_38 = max_time(local_8,local_30 - local_28);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VDotProdMultiLocal");
  }
  N_VConst(0x4000000000000000,local_8);
  N_VConst(0xbfe0000000000000,*local_40);
  N_VConst(0x3fe0000000000000,local_40[1]);
  N_VConst(0x3ff0000000000000,local_40[2]);
  local_28 = get_time();
  local_20 = N_VDotProdMultiLocal(3,local_8,local_40,&local_58);
  sync_device(local_8);
  local_30 = get_time();
  if (local_20 == 0) {
    local_1c = SUNRCompare(local_58,(double)local_10 * -1.0);
    iVar1 = SUNRCompare(local_50,(double)local_10);
    local_1c = iVar1 + local_1c;
    iVar1 = SUNRCompare(local_48,(double)local_10 * 2.0);
    local_1c = iVar1 + local_1c;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (local_14 == 0) {
      printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n",(ulong)local_14);
    local_18 = local_18 + 1;
  }
  local_38 = max_time(local_8,local_30 - local_28);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VDotProdMultiLocal");
  }
  N_VDestroyVectorArray(local_40,3);
  return local_18;
}

Assistant:

int Test_N_VDotProdMultiLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  N_Vector* V;
  sunrealtype dotprods[3];

  /* create vectors for testing */
  V = N_VCloneVectorArray(3, X);

  /*
   * Case 1: d[0] = z . V[0], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, V[0]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(1, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /*
   * Case 2: d[i] = z . V[i], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, V[0]);
  N_VConst(HALF, V[1]);
  N_VConst(ONE, V[2]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(3, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * local_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)local_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(V, 3);

  return (fails);
}